

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatrixDynSize.cpp
# Opt level: O0

MatrixDynSize * __thiscall
iDynTree::MatrixDynSize::operator=(MatrixDynSize *this,MatrixView<const_double> *other)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  double *pdVar5;
  reference peVar6;
  MatrixView<const_double> *in_RSI;
  MatrixDynSize *in_RDI;
  size_t j;
  size_t i;
  size_t requiredCapacity;
  element_type in_stack_ffffffffffffffa0;
  double *in_stack_ffffffffffffffa8;
  MatrixView<const_double> *in_stack_ffffffffffffffb0;
  ulong local_30;
  ulong local_28;
  
  sVar2 = MatrixView<const_double>::rows(in_RSI);
  in_RDI->m_rows = sVar2;
  sVar2 = MatrixView<const_double>::cols(in_RSI);
  in_RDI->m_cols = sVar2;
  uVar3 = in_RDI->m_rows * in_RDI->m_cols;
  if (uVar3 != 0) {
    if (in_RDI->m_capacity < uVar3) {
      if ((in_RDI->m_capacity != 0) &&
         (in_stack_ffffffffffffffb0 = (MatrixView<const_double> *)in_RDI->m_data,
         in_stack_ffffffffffffffb0 != (MatrixView<const_double> *)0x0)) {
        operator_delete__(in_stack_ffffffffffffffb0);
      }
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar3;
      uVar4 = SUB168(auVar1 * ZEXT816(8),0);
      if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
        uVar4 = 0xffffffffffffffff;
      }
      pdVar5 = (double *)operator_new__(uVar4);
      in_RDI->m_data = pdVar5;
      in_RDI->m_capacity = uVar3;
    }
    for (local_28 = 0; local_28 < in_RDI->m_rows; local_28 = local_28 + 1) {
      for (local_30 = 0; local_30 < in_RDI->m_cols; local_30 = local_30 + 1) {
        peVar6 = MatrixView<const_double>::operator()
                           (in_stack_ffffffffffffffb0,(index_type)in_stack_ffffffffffffffa8,
                            (index_type)in_stack_ffffffffffffffa0);
        in_stack_ffffffffffffffa0 = *peVar6;
        in_stack_ffffffffffffffa8 = in_RDI->m_data;
        sVar2 = rawIndexRowMajor(in_RDI,local_28,local_30);
        in_stack_ffffffffffffffa8[sVar2] = in_stack_ffffffffffffffa0;
      }
    }
  }
  return in_RDI;
}

Assistant:

MatrixDynSize& MatrixDynSize::operator=(MatrixView<const double> other)
{
    m_rows = other.rows();
    m_cols = other.cols();

    const std::size_t requiredCapacity = m_rows * m_cols;

    // if other is empty, return
    if (requiredCapacity == 0) return  *this;

    // If the copied data fits in the currently allocated buffer,
    // use that one (if the user want to free the memory can use
    // the shrink_to_fit method).
    // Otherwise, allocate a new buffer after deleting the old one)
    if (m_capacity < requiredCapacity) {
        // need to allocate new buffer
        // if old buffer exists, delete it
        if (m_capacity > 0) {
            delete [] m_data;
        }
        m_data = new double[requiredCapacity];
        m_capacity = requiredCapacity;
    }

    for(std::size_t i = 0; i < m_rows; i++)
    {
        for(std::size_t j = 0; j < m_cols; j++)
        {
            this->m_data[this->rawIndexRowMajor(i,j)] = other(i, j);
        }
    }

    return *this;
}